

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Button.cpp
# Opt level: O0

shared_ptr<gui::Button> gui::Button::create(Theme *theme,String *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  String *in_RSI;
  element_type *in_RDI;
  shared_ptr<gui::Button> sVar1;
  element_type *this;
  Theme *this_00;
  locale local_50 [16];
  locale *in_stack_ffffffffffffffc0;
  shared_ptr<gui::ButtonStyle> *in_stack_ffffffffffffffc8;
  Button *in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  operator_new(0x2d0);
  this_00 = (Theme *)local_50;
  std::locale::locale((locale *)this_00);
  sf::String::String((String *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
                     in_stack_ffffffffffffffc0);
  Theme::getStyle<gui::ButtonStyle>(this_00,in_RSI);
  Button(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(String *)in_stack_ffffffffffffffc0);
  std::shared_ptr<gui::Button>::shared_ptr<gui::Button,void>((shared_ptr<gui::Button> *)this,in_RDI)
  ;
  std::shared_ptr<gui::ButtonStyle>::~shared_ptr((shared_ptr<gui::ButtonStyle> *)0x22fc95);
  sf::String::~String((String *)0x22fc9f);
  std::locale::~locale(local_50);
  sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<gui::Button>)sVar1.super___shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Button> Button::create(const Theme& theme, const sf::String& name) {
    // Note that we do not use `std::make_shared` here due to the protected
    // constructor. A workaround is adding a private empty class as a parameter
    // to a public constructor (to ensure construction is still actually
    // private), but that should be unnecessary. Using the call to `new` here
    // does not cause any exception safety problems or possible leaks.
    // For details see: https://herbsutter.com/gotw/_102/
    return std::shared_ptr<Button>(new Button(theme.getStyle<ButtonStyle>("Button"), name));
}